

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_free_heap_piece(Integer memhandle,Integer nelem)

{
  Pointer pcVar1;
  Boolean BVar2;
  ulong uVar3;
  AD *ad_00;
  long lVar4;
  AD *ad;
  ulongi nbytes;
  Pointer client_space;
  AR ar;
  AD *local_48;
  ulong local_40;
  Pointer local_38;
  AR local_30;
  
  ma_stats.calls[4] = ma_stats.calls[4] + 1;
  BVar2 = mh2ad(memhandle,&local_48,BL_Heap,"MA_free_heap_piece");
  if (BVar2 == 0) {
    BVar2 = 0;
  }
  else if (nelem < 0) {
    BVar2 = 0;
    sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",local_48->name,nelem);
    ma_error(EL_Nonfatal,ET_External,"MA_free_heap_piece",ma_ebuf);
  }
  else {
    if (local_48->nelem <= nelem) {
      BVar2 = MA_free_heap(memhandle);
      return BVar2;
    }
    if (ma_trace != 0) {
      printf("MA: freeing %ld elements of \'%s\'\n",nelem,local_48->name);
    }
    local_30.datatype = local_48->datatype;
    lVar4 = local_48->nelem - nelem;
    local_30.nelem = lVar4;
    balloc_after(&local_30,(Pointer)local_48,&local_38,&local_40);
    uVar3 = local_48->nbytes - local_40;
    if (local_40 <= local_48->nbytes && uVar3 != 0) {
      if (uVar3 < 0x60) {
        ad_00 = (AD *)0x0;
      }
      else {
        ad_00 = (AD *)(local_48->name + (local_40 - 0x10));
        *(ulong *)(local_48->name + local_40 + 0x28) = uVar3;
        local_48->nbytes = local_40;
      }
      if (ad_00 != (AD *)0x0) {
        ma_stats.hbytes = ma_stats.hbytes - ad_00->nbytes;
        block_free_heap(ad_00);
      }
    }
    local_48->nelem = lVar4;
    pcVar1 = local_48->client_space;
    local_48->checksum = (ulongi)(pcVar1 + local_48->nbytes + lVar4 + local_48->datatype);
    pcVar1[-4] = -0x56;
    pcVar1[-3] = -0x56;
    pcVar1[-2] = -0x56;
    pcVar1[-1] = -0x56;
    builtin_strncpy(local_48->client_space + (long)ma_sizeof[local_48->datatype] * local_48->nelem,
                    "UUUU",4);
    BVar2 = 1;
  }
  return BVar2;
}

Assistant:

public Boolean MA_free_heap_piece(
    Integer    memhandle,    /* the block to deallocate a piece of */
    Integer    nelem         /* # of elements to deallocate */)
{
    AD        *ad;        /* AD for memhandle */
    AD        *ad_reclaim;    /* AD for data returned */
    AR        ar;        /* AR for data kept */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for data kept */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_free_heap_piece]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Heap, "MA_free_heap_piece"))
        return MA_FALSE;

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            ad->name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_free_heap_piece", ma_ebuf);
        return MA_FALSE;
    }
    else if (nelem >= ad->nelem)
    {
        /* deallocate the whole block */
        return MA_free_heap(memhandle);
    }

    if (ma_trace) 
    (void)printf("MA: freeing %ld elements of '%s'\n",
            (size_t)nelem, ad->name);

    /* set AR for data to keep */
    ar.datatype = ad->datatype;
    ar.nelem = ad->nelem - nelem;

    /* perform trial allocation to determine size */
    balloc_after(&ar, (Pointer)ad, &client_space, &nbytes);

    if (nbytes < ad->nbytes)
    {
        /* ad has extra space; split block if possible */
        ad_reclaim = block_split(ad, nbytes, (Boolean)MA_FALSE);

        if (ad_reclaim)
        {
#ifdef STATS
            ma_stats.hbytes -= ad_reclaim->nbytes;
#endif /* STATS */

            /* reclaim the deallocated (new) block */
            block_free_heap(ad_reclaim);
        }
    }

    /* update surviving block */
    ad->nelem = ar.nelem;
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* success */
    return MA_TRUE;
}